

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O2

void boost::unit_test::utils::print_escaped(ostream *where_to,const_string *value)

{
  iterator pvVar1;
  int iVar2;
  const_iterator cVar3;
  ostream *poVar4;
  long lVar5;
  iterator pvVar6;
  char cVar7;
  undefined8 *puVar8;
  iterator ppVar9;
  byte bVar10;
  initializer_list<std::pair<const_char,_const_char_*>_> __l;
  allocator_type local_82;
  less<char> local_81;
  char c;
  
  bVar10 = 0;
  if ((print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)::char_type == '\0')
     && (iVar2 = __cxa_guard_acquire(&print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)
                                      ::char_type), iVar2 != 0)) {
    puVar8 = &DAT_001dffa0;
    ppVar9 = (iterator)&c;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)ppVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
      ppVar9 = (iterator)&ppVar9[-(ulong)bVar10].second;
    }
    __l._M_len = 5;
    __l._M_array = (iterator)&c;
    std::
    map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
    ::map(&print_escaped::char_type,__l,&local_81,&local_82);
    __cxa_atexit(std::
                 map<char,_const_char_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
                 ::~map,&print_escaped::char_type,&__dso_handle);
    __cxa_guard_release(&print_escaped(std::ostream&,boost::unit_test::basic_cstring<char_const>)::
                         char_type);
  }
  pvVar1 = value->m_end;
  for (pvVar6 = value->m_begin; pvVar6 != pvVar1; pvVar6 = pvVar6 + 1) {
    c = *pvVar6;
    cVar3 = std::
            _Rb_tree<char,_std::pair<const_char,_const_char_*>,_std::_Select1st<std::pair<const_char,_const_char_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_const_char_*>_>_>
            ::find(&print_escaped::char_type._M_t,&c);
    poVar4 = where_to;
    cVar7 = c;
    if ((_Rb_tree_header *)cVar3._M_node !=
        &print_escaped::char_type._M_t._M_impl.super__Rb_tree_header) {
      poVar4 = std::operator<<(where_to,'&');
      poVar4 = std::operator<<(poVar4,(char *)cVar3._M_node[1]._M_parent);
      cVar7 = ';';
    }
    std::operator<<(poVar4,cVar7);
  }
  return;
}

Assistant:

inline void
print_escaped( std::ostream& where_to, const_string value )
{
#if !defined(BOOST_NO_CXX11_HDR_INITIALIZER_LIST) && !defined(BOOST_NO_CXX11_UNIFIED_INITIALIZATION_SYNTAX)
    static std::map<char,char const*> const char_type{{
        {'<' , "lt"},
        {'>' , "gt"},
        {'&' , "amp"},
        {'\'', "apos"},
        {'"' , "quot"}
    }};
#else
    static std::map<char,char const*> char_type;

    if( char_type.empty() ) {
        char_type['<'] = "lt";
        char_type['>'] = "gt";
        char_type['&'] = "amp";
        char_type['\'']= "apos";
        char_type['"'] = "quot";
    }
#endif

    BOOST_TEST_FOREACH( char, c, value ) {
        std::map<char,char const*>::const_iterator found_ref = char_type.find( c );

        if( found_ref != char_type.end() )
            where_to << '&' << found_ref->second << ';';
        else
            where_to << c;
    }
}